

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O2

real cnn::as_scalar(Tensor *t)

{
  uint uVar1;
  
  uVar1 = Dim::size(&t->d);
  if (uVar1 == 1) {
    return *t->v;
  }
  __assert_fail("t.d.size() == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/tensor.cc"
                ,0x1b,"real cnn::as_scalar(const Tensor &)");
}

Assistant:

real as_scalar(const Tensor& t) {
  assert(t.d.size() == 1);
#if HAVE_CUDA
  float res;
  CUDA_CHECK(cudaMemcpy(&res, t.v, sizeof(float), cudaMemcpyDeviceToHost));
  return res;
#else
  return t.v[0];
#endif
}